

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.c
# Opt level: O2

void mmk_mock_reset_call(char *file,int line)

{
  long in_FS_OFFSET;
  
  if (*(int *)(in_FS_OFFSET + -0x28) == 1) {
    *(undefined4 *)(in_FS_OFFSET + -0x28) = 0;
    return;
  }
  if (*(int *)(in_FS_OFFSET + -0x28) == 0) {
    mmk_panic("mimick: %s:%d: mocked function was never called -- was it optimized away?\n",file,
              line);
  }
  mmk_panic("mimick: %s:%d: mocked function was called more than once (exactly %u times) in the call expression.\n"
            ,file,line);
}

Assistant:

void mmk_mock_reset_call(const char *file, int line)
{
    unsigned val = tls_get(unsigned, mock_called);
    if (!val) {
        mmk_panic("mimick: %s:%d: mocked function was never called "
                  "-- was it optimized away?\n", file, line);
    }
    if (val > 1) {
        mmk_panic("mimick: %s:%d: mocked function was called more than once "
                  "(exactly %u times) in the call expression.\n",
                  file, line, val);
    }
    tls_set(unsigned, mock_called, 0);
}